

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

Mesh * Omega_h::read_mesh_file(Mesh *__return_storage_ptr__,path *path,CommPtr *comm)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  Library *pLVar4;
  undefined8 uVar5;
  value_type_conflict *pvVar6;
  shared_ptr<Omega_h::Comm> local_2d0;
  istream local_2c0 [8];
  ifstream stream;
  shared_ptr<Omega_h::Comm> local_b0;
  undefined1 local_99;
  shared_ptr<Omega_h::Comm> local_98;
  undefined4 local_84;
  shared_ptr<Omega_h::Comm> local_80 [2];
  path local_60;
  undefined1 local_40 [8];
  string extension;
  CommPtr *comm_local;
  path *path_local;
  Mesh *mesh;
  
  filesystem::path::extension(&local_60,path);
  filesystem::path::string_abi_cxx11_((path *)local_40);
  filesystem::path::~path(&local_60);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,".osh");
  if (bVar1) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(local_80,comm);
    binary::read((binary *)__return_storage_ptr__,(int)path,local_80,0);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(local_80);
    local_84 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,".meshb");
    if (bVar1) {
      pvVar6 = filesystem::path::c_str(path);
      fail("Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_libMeshb=ON\n",pvVar6);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,".exo");
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40,".e"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,".g"), bVar1)) {
      pvVar6 = filesystem::path::c_str(path);
      fail("Omega_h: Can\'t read %s without reconfiguring with OMEGA_H_USE_SEACASExodus=ON\n",pvVar6
          );
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,".msh");
    if (bVar1) {
      std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_98,comm);
      gmsh::read((int)__return_storage_ptr__,path,(size_t)&local_98);
      std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_98);
      local_84 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,".pvtu");
      if (bVar1) {
        local_99 = 0;
        peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)comm);
        pLVar4 = Comm::library(peVar3);
        Mesh::Mesh(__return_storage_ptr__,pLVar4);
        std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_b0,comm);
        vtk::read_parallel(path,&local_b0,__return_storage_ptr__);
        std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_b0);
        Mesh::set_comm(__return_storage_ptr__,comm);
        local_84 = 1;
        local_99 = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,".vtu");
        if (!bVar1) {
          uVar5 = std::__cxx11::string::c_str();
          pvVar6 = filesystem::path::c_str(path);
          fail("Unknown file extension \"%s\" on \"%s\"\n",uVar5,pvVar6);
        }
        peVar3 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)comm);
        pLVar4 = Comm::library(peVar3);
        Mesh::Mesh(__return_storage_ptr__,pLVar4);
        pvVar6 = filesystem::path::c_str(path);
        std::ifstream::ifstream(local_2c0,pvVar6,_S_in);
        bVar2 = std::ifstream::is_open();
        if ((bVar2 & 1) == 0) {
          fail("assertion %s failed at %s +%d\n","stream.is_open()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
               ,0x2ae);
        }
        std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_2d0,comm);
        vtk::read_vtu(local_2c0,&local_2d0,__return_storage_ptr__);
        std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_2d0);
        local_84 = 1;
        std::ifstream::~ifstream(local_2c0);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

OMEGA_H_DLL Mesh read_mesh_file(filesystem::path const& path, CommPtr comm) {
  auto const extension = path.extension().string();
  if (extension == ".osh") {
    return binary::read(path, comm);
  } else if (extension == ".meshb") {
#ifdef OMEGA_H_USE_LIBMESHB
    Mesh mesh(comm->library());
    meshb::read(&mesh, path.c_str());
    mesh.set_comm(comm);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_libMeshb=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".exo" || extension == ".e" || extension == ".g") {
#ifdef OMEGA_H_USE_SEACASEXODUS
    Mesh mesh(comm->library());
    auto file = exodus::open(path);
    exodus::read_mesh(file, &mesh);
    mesh.set_comm(comm);
    exodus::close(file);
    return mesh;
#else
    Omega_h_fail(
        "Omega_h: Can't read %s without reconfiguring with "
        "OMEGA_H_USE_SEACASExodus=ON\n",
        path.c_str());
    OMEGA_H_NORETURN(Mesh());
#endif
  } else if (extension == ".msh") {
    return gmsh::read(path, comm);
  } else if (extension == ".pvtu") {
    Mesh mesh(comm->library());
    vtk::read_parallel(path, comm, &mesh);
    mesh.set_comm(comm);
    return mesh;
  } else if (extension == ".vtu") {
    Mesh mesh(comm->library());
    std::ifstream stream(path.c_str());
    OMEGA_H_CHECK(stream.is_open());
    vtk::read_vtu(stream, comm, &mesh);
    return mesh;
  } else {
    Omega_h_fail("Unknown file extension \"%s\" on \"%s\"\n", extension.c_str(),
        path.c_str());
  }
}